

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O3

ptrlen BinarySource_get_chars_internal(BinarySource *src,char *set,_Bool include)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  ptrlen pVar6;
  
  pvVar1 = src->data;
  sVar2 = src->pos;
  sVar5 = sVar2;
  if (src->err == BSE_NO_ERROR) {
    sVar3 = src->len;
    while (sVar3 != sVar5) {
      pcVar4 = strchr(set,(int)*(char *)((long)pvVar1 + sVar5));
      if ((pcVar4 == (char *)0x0) == include) goto LAB_0016cf02;
      sVar5 = sVar5 + 1;
      src->pos = sVar5;
    }
    src->err = BSE_OUT_OF_DATA;
    sVar5 = sVar3;
  }
LAB_0016cf02:
  pVar6.len = sVar5 - sVar2;
  pVar6.ptr = (void *)((long)pvVar1 + sVar2);
  return pVar6;
}

Assistant:

static ptrlen BinarySource_get_chars_internal(
    BinarySource *src, const char *set, bool include)
{
    const char *start = here;
    while (avail(1)) {
        bool present = NULL != strchr(set, *(const char *)consume(0));
        if (present != include)
            break;
        (void) consume(1);
    }
    const char *end = here;
    return make_ptrlen(start, end - start);
}